

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pedestrian.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_70a26::PedestrianPlugIn::reset(PedestrianPlugIn *this)

{
  bool bVar1;
  __normal_iterator<(anonymous_namespace)::Pedestrian_*const_*,_std::vector<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>_>
  *in_RDI;
  iterator i;
  Pedestrian *in_stack_000000b0;
  vector<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>
  *in_stack_ffffffffffffffc8;
  __normal_iterator<(anonymous_namespace)::Pedestrian_*const_*,_std::vector<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>_>
  in_stack_ffffffffffffffd8;
  __normal_iterator<(anonymous_namespace)::Pedestrian_*const_*,_std::vector<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>_>
  local_10 [2];
  
  std::
  vector<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>
  ::begin(in_stack_ffffffffffffffc8);
  __gnu_cxx::
  __normal_iterator<(anonymous_namespace)::Pedestrian*const*,std::vector<(anonymous_namespace)::Pedestrian*,std::allocator<(anonymous_namespace)::Pedestrian*>>>
  ::__normal_iterator<(anonymous_namespace)::Pedestrian**>
            (in_RDI,(__normal_iterator<(anonymous_namespace)::Pedestrian_**,_std::vector<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>_>
                     *)in_stack_ffffffffffffffc8);
  while( true ) {
    std::
    vector<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>
    ::end(in_stack_ffffffffffffffc8);
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<(anonymous_namespace)::Pedestrian_**,_std::vector<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>_>
                               *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<(anonymous_namespace)::Pedestrian_*const_*,_std::vector<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>_>
    ::operator*(local_10);
    Pedestrian::reset(in_stack_000000b0);
    in_stack_ffffffffffffffd8 =
         __gnu_cxx::
         __normal_iterator<(anonymous_namespace)::Pedestrian_*const_*,_std::vector<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>_>
         ::operator++(in_stack_ffffffffffffffd8._M_current,(int)((ulong)in_RDI >> 0x20));
  }
  OpenSteer::OpenSteerDemo::position2dCamera((AbstractVehicle *)0x1526dc);
  OpenSteer::Camera::doNotSmoothNextMove(&OpenSteer::OpenSteerDemo::camera);
  return;
}

Assistant:

void reset (void)
        {
            // reset each Pedestrian
            for (iterator i = crowd.begin(); i != crowd.end(); i++) (**i).reset ();

            // reset camera position
            OpenSteerDemo::position2dCamera (*OpenSteerDemo::selectedVehicle);

            // make camera jump immediately to new position
            OpenSteerDemo::camera.doNotSmoothNextMove ();
        }